

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O2

void __thiscall
google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>::StatusOr
          (StatusOr<const_google::protobuf::Enum_*> *this,Enum **value)

{
  undefined1 local_50 [40];
  StringPiece local_28;
  
  Status::Status(&this->status_);
  if (*value == (Enum *)0x0) {
    StringPiece::StringPiece(&local_28,"nullptr is not a valid argument.");
    Status::Status((Status *)local_50,INTERNAL,local_28);
    Status::operator=(&this->status_,(Status *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  else {
    Status::operator=(&this->status_,(Status *)Status::OK);
    this->value_ = *value;
  }
  return;
}

Assistant:

inline StatusOr<T>::StatusOr(const T& value) {
  if (internal::StatusOrHelper::Specialize<T>::IsValueNull(value)) {
    status_ = Status(error::INTERNAL, "nullptr is not a valid argument.");
  } else {
    status_ = Status::OK;
    value_ = value;
  }
}